

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O2

int solveSCIP(char *filename)

{
  char cVar1;
  int iVar2;
  int col;
  ulong uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  int colBoundIndex;
  double og_colUpper;
  double og_colLower;
  vector<double,_std::allocator<double>_> colPrimal;
  double nw_colUpper;
  double dStack_16040;
  vector<double,_std::allocator<double>_> X0Avalue;
  vector<int,_std::allocator<int>_> X0Aindex;
  vector<int,_std::allocator<int>_> X0Astart;
  vector<double,_std::allocator<double>_> X0colUpper;
  vector<double,_std::allocator<double>_> X0colLower;
  vector<double,_std::allocator<double>_> X0colCost;
  vector<double,_std::allocator<double>_> X0ARvalue;
  vector<int,_std::allocator<int>_> X0ARindex;
  vector<int,_std::allocator<int>_> X0ARstart;
  vector<double,_std::allocator<double>_> X0rowUpper;
  vector<double,_std::allocator<double>_> X0rowLower;
  vector<double,_std::allocator<double>_> XARvalue;
  vector<int,_std::allocator<int>_> XARindex;
  vector<int,_std::allocator<int>_> XARstart;
  vector<double,_std::allocator<double>_> XrowUpper;
  vector<double,_std::allocator<double>_> XrowLower;
  vector<double,_std::allocator<double>_> XAvalue;
  vector<int,_std::allocator<int>_> XAindex;
  vector<int,_std::allocator<int>_> XAstart;
  vector<double,_std::allocator<double>_> XcolUpper;
  vector<double,_std::allocator<double>_> XcolLower;
  vector<double,_std::allocator<double>_> XcolCost;
  vector<double,_std::allocator<double>_> rowUpper;
  vector<double,_std::allocator<double>_> rowLower;
  vector<double,_std::allocator<double>_> rowDual;
  vector<double,_std::allocator<double>_> rowPrimal;
  vector<double,_std::allocator<double>_> colUpper;
  vector<double,_std::allocator<double>_> colLower;
  vector<double,_std::allocator<double>_> colDual;
  HModel model;
  uint uStack_156c4;
  uint uStack_156c0;
  long lStack_15568;
  HDual solver;
  
  HModel::HModel(&model);
  puts("Called solveSCIP");
  std::ostream::flush();
  iVar2 = HModel::load_fromMPS((char *)&model);
  if (iVar2 == 0) {
    XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    XAvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    HModel::util_deleteCols((int)&model,uStack_156c4 - 3);
    XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    XARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    XARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    XARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    XARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    XARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    XARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    XARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    HModel::util_deleteRows((int)&model,uStack_156c0 - 3);
    X0rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    X0rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    X0rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    X0ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    X0ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    X0ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0ARvalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    HModel::util_deleteRows((int)&model,0);
    X0colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    X0colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    X0colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    X0colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    X0Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    X0Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    X0Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    X0Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    X0Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    X0Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    X0Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    HModel::util_deleteCols((int)&model,0);
    HModel::util_addCols
              ((int)&model,(double *)(ulong)uStack_156c4,
               X0colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               X0colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (int)X0colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(int *)0x0,
               X0Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (double *)
               X0Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    HModel::util_addRows
              ((int)&model,(double *)(ulong)uStack_156c0,
               X0rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (int)X0rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
               (int *)(ulong)(uint)X0ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)uStack_156c0],
               X0ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (double *)
               X0ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    HModel::util_addRows
              ((int)&model,(double *)0x3,
               XrowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (int)XrowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
               (int *)(ulong)(uint)XARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[3],
               XARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (double *)
               XARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    HModel::util_addCols
              ((int)&model,(double *)0x3,
               XcolCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               XcolLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (int)XcolUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
               (int *)(ulong)(uint)XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[3],
               XAstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,
               (double *)
               XAindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start);
    HModel::scaleModel();
    HDual::HDual(&solver);
    HDual::solve((HModel *)&solver,(int)&model,0);
    HModel::util_reportModelSolution();
    HModel::util_reportSolverOutcome((char *)&model);
    std::vector<double,_std::allocator<double>_>::vector
              (&colPrimal,(long)(int)uStack_156c4,(allocator_type *)&colDual);
    std::vector<double,_std::allocator<double>_>::vector
              (&colDual,(long)(int)uStack_156c4,(allocator_type *)&colLower);
    std::vector<double,_std::allocator<double>_>::vector
              (&colLower,(long)(int)uStack_156c4,(allocator_type *)&colUpper);
    std::vector<double,_std::allocator<double>_>::vector
              (&colUpper,(long)(int)uStack_156c4,(allocator_type *)&rowPrimal);
    std::vector<double,_std::allocator<double>_>::vector
              (&rowPrimal,(long)(int)uStack_156c0,(allocator_type *)&rowDual);
    std::vector<double,_std::allocator<double>_>::vector
              (&rowDual,(long)(int)uStack_156c0,(allocator_type *)&rowLower);
    std::vector<double,_std::allocator<double>_>::vector
              (&rowLower,(long)(int)uStack_156c0,(allocator_type *)&rowUpper);
    std::vector<double,_std::allocator<double>_>::vector
              (&rowUpper,(long)(int)uStack_156c0,(allocator_type *)&og_colLower);
    HModel::util_getPrimalDualValues
              ((vector *)&model,(vector *)&colPrimal,(vector *)&colDual,(vector *)&rowPrimal);
    HModel::util_getColBounds
              ((int)&model,0,(double *)(ulong)(uStack_156c4 - 1),
               colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    iVar2 = 0;
    HModel::util_getRowBounds
              ((int)&model,0,(double *)(ulong)(uStack_156c0 - 1),
               rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    for (uVar3 = 0; (long)uVar3 < (long)(int)uStack_156c4; uVar3 = uVar3 + 1) {
      iVar4 = (int)&model;
      HModel::util_getColBounds(iVar4,(int)uVar3,(double *)(uVar3 & 0xffffffff),&og_colLower);
      printf("\nColumn %2d has primal value %11g and bounds [%11g, %11g]",
             colPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3],og_colLower,og_colUpper,uVar3 & 0xffffffff);
      if (*(int *)(lStack_15568 + uVar3 * 4) == 0) {
        dVar6 = colPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3] - og_colLower;
        dVar5 = og_colUpper -
                colPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        if (dVar6 <= dVar5) {
          dVar5 = dVar6;
        }
        if (0.1 <= dVar5) {
          printf(": basic with rsdu = %11g so branch\n\n");
          colBoundIndex = (int)uVar3;
          cVar1 = HModel::hsol_isInfinity(og_colUpper);
          dStack_16040 = og_colUpper;
          if (cVar1 != '\0') {
            dStack_16040 = colPrimal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar3] + 1.0;
          }
          printf("Calling model.util_chgColBounds(1, %d, %g, %g)\n",(ulong)(uint)colBoundIndex);
          HModel::util_chgColBoundsSet(iVar4,(int *)0x1,(double *)&colBoundIndex,&dStack_16040);
          puts("Calling model.scaleModel()");
          HModel::scaleModel();
          HDual::solve((HModel *)&solver,iVar4,0);
          HModel::util_reportSolverOutcome((char *)&model);
          HModel::util_chgColBoundsSet(iVar4,(int *)0x1,(double *)&colBoundIndex,&og_colLower);
          if (8 < iVar2) break;
          iVar2 = iVar2 + 1;
        }
        else {
          printf(": basic but rsdu = %11g so don\'t branch\n");
        }
      }
      else {
        puts(": nonbasic so don\'t branch");
      }
    }
    puts("Returning from solveSCIP");
    std::ostream::flush();
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rowUpper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rowLower.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rowDual.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rowPrimal.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&colUpper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&colLower.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&colDual.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&colPrimal.super__Vector_base<double,_std::allocator<double>_>);
    HDual::~HDual(&solver);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&X0Avalue.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&X0Aindex.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&X0Astart.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&X0colUpper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&X0colLower.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&X0colCost.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&X0ARvalue.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&X0ARindex.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&X0ARstart.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&X0rowUpper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&X0rowLower.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&XARvalue.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&XARindex.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&XARstart.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&XrowUpper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&XrowLower.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&XAvalue.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&XAindex.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&XAstart.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&XcolUpper.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&XcolLower.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&XcolCost.super__Vector_base<double,_std::allocator<double>_>);
    iVar2 = 0;
  }
  HModel::~HModel(&model);
  return iVar2;
}

Assistant:

int solveSCIP(const char *filename) {
  HModel model;
  printf("Called solveSCIP\n");cout << flush;
  int RtCd = model.load_fromMPS(filename);
  if (RtCd) return RtCd;
  //  model.util_reportModel();

  //Extract columns numCol-3..numCol-1
  int FmCol = model.numCol-3;
  int ToCol = model.numCol-1;
  int numExtractCols = ToCol-FmCol+1;
  vector<double> XcolCost;
  vector<double> XcolLower;
  vector<double> XcolUpper;
  vector<int> XAstart;
  vector<int> XAindex;
  vector<double> XAvalue;
  //  model.util_extractCols(FmCol, ToCol, XcolCost, XcolLower, XcolUpper,
  //			 XAstart, XAindex, XAvalue);

  //  printf("Returned from model.util_extractCols with\n");
  //  model.util_reportColVec(numExtractCols, XcolCost, XcolLower, XcolUpper);
  //  model.util_reportColMtx(numExtractCols, XAstart, XAindex, XAvalue);
  
  //Delete the columns just extracted
  model.util_deleteCols(FmCol, ToCol);
  //  model.util_reportModel();

  //Extract rows numRow-3..numRow-1
  int FmRow = model.numRow-3;
  int ToRow = model.numRow-1;
  int numExtractRows = ToRow-FmRow+1;
  vector<double> XrowLower;
  vector<double> XrowUpper;
  vector<int> XARstart;
  vector<int> XARindex;
  vector<double> XARvalue;
  //  model.util_extractRows(FmRow, ToRow, &(*XrowLower.begin()), &(*XrowUpper.begin()),
  // &(*XARstart.begin()), &(*XARindex.begin()), &(*XARvalue.begin()));

  //  printf("Returned from model.util_extractRows with\n");
  //  model.util_reportRowVec(numExtractRows, XrowLower, XrowUpper);
  //  model.util_reportRowMtx(numExtractRows, XARstart, XARindex, XARvalue);
  
  //Delete the rows just extracted
  model.util_deleteRows(FmRow, ToRow);
  //  model.util_reportModel();

  //Extract all remaining rows
  FmRow = 0;
  ToRow = model.numRow-1;
  int num0ExtractRows = ToRow-FmRow+1;
  vector<double> X0rowLower;
  vector<double> X0rowUpper;
  vector<int> X0ARstart;
  vector<int> X0ARindex;
  vector<double> X0ARvalue;

  //model.util_extractRows(FmRow, ToRow, &(*X0rowLower.begin()), &(*X0rowUpper.begin()),
  //			 &(*X0ARstart.begin()), &(*X0ARindex.begin()), &(*X0ARvalue.begin()));

  //Delete the rows just extracted
  model.util_deleteRows(FmRow, ToRow);
  //  model.util_reportModel();

  //Extract all remaining columns
  FmCol = 0;
  ToCol = model.numCol-1;
  int num0ExtractCols = ToCol-FmCol+1;
  vector<double> X0colCost;
  vector<double> X0colLower;
  vector<double> X0colUpper;
  vector<int> X0Astart;
  vector<int> X0Aindex;
  vector<double> X0Avalue;
  //  model.util_extractCols(FmCol, ToCol, X0colCost, X0colLower, X0colUpper,
  //			 X0Astart, X0Aindex, X0Avalue);
  
  //Delete the columns just extracted
  model.util_deleteCols(FmCol, ToCol);
  //  model.util_reportModel();

  int nnonz = 0;
  model.util_addCols(num0ExtractCols, &X0colCost[0], &X0colLower[0], &X0colUpper[0],
		     nnonz, &X0Astart[0], &X0Aindex[0], &X0Avalue[0]);
  //  model.util_reportModel();
  
  nnonz = X0ARstart[num0ExtractRows];
  model.util_addRows(num0ExtractRows, &X0rowLower[0], &X0rowUpper[0],
		     nnonz, &X0ARstart[0], &X0ARindex[0], &X0ARvalue[0]);
  //  model.util_reportModel();

  nnonz = XARstart[numExtractRows];
  model.util_addRows(numExtractRows, &XrowLower[0], &XrowUpper[0],
		     nnonz, &XARstart[0], &XARindex[0], &XARvalue[0]);
  //  model.util_reportModel();

  nnonz = XAstart[numExtractCols];
  model.util_addCols(numExtractCols, &XcolCost[0], &XcolLower[0], &XcolUpper[0],
		     nnonz, &XAstart[0], &XAindex[0], &XAvalue[0]);
  //  model.util_reportModel();
  
  model.numTot = model.numCol + model.numRow;
  model.scaleModel();
  HDual solver;
  solver.solve(&model);
  model.util_reportModelSolution();
  model.util_reportSolverOutcome("SCIP 1");

  vector<double> colPrimal(model.numCol);
  vector<double> colDual(model.numCol);
  vector<double> colLower(model.numCol);
  vector<double> colUpper(model.numCol);
  vector<double> rowPrimal(model.numRow);
  vector<double> rowDual(model.numRow);
  vector<double> rowLower(model.numRow);
  vector<double> rowUpper(model.numRow);
  model.util_getPrimalDualValues(colPrimal, colDual, rowPrimal, rowDual);
  model.util_getColBounds(0, model.numCol-1, &colLower[0], &colUpper[0]);
  model.util_getRowBounds(0, model.numRow-1, &rowLower[0], &rowUpper[0]);

  double og_colLower;
  double og_colUpper;
  int colBoundIndex;
  double nw_colLower;
  double nw_colUpper;

  int num_resolve = 0;
  for (int col = 0; col < model.numCol; col++) {
    model.util_getColBounds(col, col, &og_colLower, &og_colUpper);
    printf("\nColumn %2d has primal value %11g and bounds [%11g, %11g]", col, colPrimal[col], og_colLower, og_colUpper);
    if (model.nonbasicFlag[col]) {
      printf(": nonbasic so don't branch\n");
      continue;
    } else {
      double rsdu = min(colPrimal[col]-og_colLower, og_colUpper-colPrimal[col]);
      if (rsdu < 0.1) {
	printf(": basic but rsdu = %11g so don't branch\n", rsdu);
	continue;
      }
      printf(": basic with rsdu = %11g so branch\n\n", rsdu);
      num_resolve++;
      colBoundIndex = col;
      if (model.hsol_isInfinity(og_colUpper)) 
	nw_colLower = colPrimal[col]+1;
      else
	nw_colLower = og_colUpper;
      nw_colUpper = og_colUpper;
      printf("Calling model.util_chgColBounds(1, %d, %g, %g)\n", colBoundIndex, nw_colLower, nw_colUpper);
      model.util_chgColBoundsSet(1, &colBoundIndex, &nw_colLower, &nw_colUpper);
      printf("Calling model.scaleModel()\n");
      model.scaleModel();
      //      printf("Calling solver.solve(&model)\n");
      solver.solve(&model);
      //      printf("Called solver.solve(&model)\n");
      model.util_reportSolverOutcome("SCIP 2");
      //Was &nw_colLower, &nw_colUpper); and might be more interesting for avgas
      model.util_chgColBoundsSet(1, &colBoundIndex, &og_colLower, &og_colUpper);
      if (num_resolve >= 10) break;
    }
  }
  printf("Returning from solveSCIP\n"); cout << flush;
  return 0;
}